

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cpp
# Opt level: O2

int SearchCut(Situation *situation,int depth,int beta,bool allowNullMove)

{
  undefined1 uVar1;
  undefined1 uVar3;
  undefined1 uVar4;
  uint uVar2;
  undefined1 uVar6;
  undefined4 uVar8;
  Movement hash_move;
  bool bVar9;
  int iVar10;
  clock_t cVar11;
  undefined8 uVar12;
  long lVar13;
  undefined4 in_register_00000034;
  undefined4 uVar14;
  Movement *all_movements;
  uint depth_00;
  Movement move;
  Movement move_00;
  int local_66c;
  Movement local_668;
  undefined4 local_65c;
  undefined8 local_658;
  int local_64c;
  int local_648;
  int move_num;
  undefined1 local_640 [8];
  Movement move_list [128];
  undefined6 uVar5;
  undefined5 uVar7;
  
  local_658 = CONCAT44(in_register_00000034,depth);
  local_668.from = '\0';
  local_668.to = '\0';
  local_668.capture = '\0';
  local_668._3_1_ = 0;
  local_668.value = 0;
  local_668.catc = '\0';
  local_668.movec = '\0';
  local_668._10_2_ = 0;
  if (depth < 1) {
    iVar10 = QuiescentSearch(situation,beta + -1,beta);
    return iVar10;
  }
  iVar10 = beta;
  if (step + -10000 < beta) {
    local_65c._0_1_ = '\0';
    local_65c._1_1_ = '\0';
    local_65c._2_2_ = 0;
    local_648 = beta + -1;
    iVar10 = ReadHashTable(depth,local_648,beta,&local_668);
    if (iVar10 == 0x100000) {
      uVar2 = (uint)local_658;
      if ((allowNullMove && 0xfa < situation->value[situation->current_player]) &&
         (bVar9 = BeChecked(situation), !bVar9)) {
        MakeNullMove(situation);
        iVar10 = SearchCut(situation,uVar2 - 3,1 - beta,false);
        UnMakeNullMove(situation);
        if ((beta <= -iVar10) &&
           (iVar10 = SearchCut(situation,uVar2 - 2,beta,false), beta <= iVar10)) {
          depth_00 = 2;
          if (2 < uVar2) {
            depth_00 = uVar2;
          }
          uVar12._0_1_ = '\0';
          uVar12._1_1_ = '\0';
          uVar12._2_1_ = '\0';
          uVar12._3_1_ = 0;
          uVar12._4_4_ = 0;
          uVar14._0_1_ = '\0';
          uVar14._1_1_ = '\0';
          uVar14._2_2_ = 0;
LAB_0010a37b:
          move_00.catc = (UINT8)uVar14;
          move_00.movec = SUB41(uVar14,1);
          move_00._10_2_ = SUB42(uVar14,2);
          move_00.from = (UINT8)uVar12;
          move_00.to = SUB81(uVar12,1);
          move_00.capture = SUB81(uVar12,2);
          move_00._3_1_ = SUB81(uVar12,3);
          move_00.value = SUB84(uVar12,4);
          SaveHashTable(depth_00,beta,'\x02',move_00);
          return beta;
        }
      }
      if ((isTimeLimit == false) && (cVar11 = clock(), cVar11 - StartTime < 0x9c41)) {
        local_640[0] = '\0';
        local_640[1] = '\0';
        local_640[2] = '\0';
        local_640[3] = 0;
        local_640._4_4_ = 0;
        local_66c = -0x100000;
        move_num = 0;
        hash_move.to = local_668.to;
        hash_move.from = local_668.from;
        hash_move.capture = local_668.capture;
        hash_move._3_1_ = local_668._3_1_;
        hash_move.value = local_668.value;
        hash_move.catc = local_668.catc;
        hash_move.movec = local_668.movec;
        hash_move._10_2_ = local_668._10_2_;
        all_movements = move_list;
        MoveSort(situation,&move_num,all_movements,hash_move,step);
        local_64c = uVar2 - 1;
        for (lVar13 = 0; iVar10 = local_648, lVar13 < move_num; lVar13 = lVar13 + 1) {
          uVar1 = all_movements->from;
          uVar3 = all_movements->to;
          uVar4 = all_movements->capture;
          uVar6 = all_movements->field_0x3;
          uVar8 = all_movements->value;
          uVar7 = CONCAT41(uVar8,uVar6);
          uVar5 = CONCAT51(uVar7,uVar4);
          local_668.catc = all_movements->catc;
          local_668.movec = all_movements->movec;
          local_668._10_2_ = *(undefined2 *)&all_movements->field_0xa;
          local_668.from = uVar1;
          local_668.to = uVar3;
          local_668._2_6_ = uVar5;
          if (uVar1 != '\0' || uVar3 != '\0') {
            bVar9 = MakeAMove(situation,&local_668,false);
            if (bVar9) {
              iVar10 = step + -10000;
            }
            else {
              iVar10 = SearchCut(situation,local_64c,1 - beta,true);
              iVar10 = -iVar10;
            }
            UnMakeAMove(situation);
            if (local_66c < iVar10) {
              if (beta <= iVar10) {
                depth_00 = (uint)local_658;
                SetBestMove(&local_668,step,depth_00);
                uVar12._1_1_ = local_668.to;
                uVar12._0_1_ = local_668.from;
                uVar12._2_1_ = local_668.capture;
                uVar12._3_1_ = local_668._3_1_;
                uVar12._4_4_ = local_668.value;
                uVar14 = local_668._8_4_;
                goto LAB_0010a37b;
              }
              local_640[1] = local_668.to;
              local_640[0] = local_668.from;
              local_640[2] = local_668.capture;
              local_640[3] = local_668._3_1_;
              local_640._4_4_ = local_668.value;
              local_65c._0_1_ = local_668.catc;
              local_65c._1_1_ = local_668.movec;
              local_65c._2_2_ = local_668._10_2_;
              local_66c = iVar10;
            }
          }
          all_movements = all_movements + 1;
        }
        move.catc = (UINT8)local_65c;
        move.movec = local_65c._1_1_;
        move._10_2_ = local_65c._2_2_;
        move.from = local_640[0];
        move.to = local_640[1];
        move.capture = local_640[2];
        move._3_1_ = local_640[3];
        move.value = local_640._4_4_;
        SaveHashTable((int)local_658,local_648,'\x01',move);
      }
      else {
        isTimeLimit = true;
        iVar10 = 0x100000;
      }
    }
  }
  return iVar10;
}

Assistant:

int SearchCut(Situation& situation, int depth, int beta, bool allowNullMove = false){
    int value;                      // 下一着法的分值
    int best;                       // 所有着法中的最佳分值
    Movement move_list[128];        // 当前所有着法
    Movement move;                  // 当前着法
    Movement good_move;             // 当前局面最佳着法
    move = good_move = NONE_MOVE;
    best = -NONE_VALUE;

    // 到达搜索深度
    if(depth <= 0){
        // 静态搜索评估
        return QuiescentSearch(situation, beta - 1, beta);
    }

    if(step - MAX_VALUE >= beta)
        return beta;

    // 置换表裁剪
    value = ReadHashTable(depth, beta - 1, beta, move);
    if(value != NONE_VALUE){
        return value;
    }

    // 空着裁剪(带检验)
    if(!BanNullMove(situation) && allowNullMove && !BeChecked(situation)){
        MakeNullMove(situation);
        value = -SearchCut(situation, depth - 1 - NULL_REDUCTION, 1 - beta);
        UnMakeNullMove(situation);

        if(value >= beta && SearchCut(situation, depth - NULL_REDUCTION, beta) >= beta){
            SaveHashTable(max(depth, NULL_REDUCTION), beta, hashBETA, NONE_MOVE);
            return beta;
        }
    }

    // 时间检测，避免超限
    if(isTimeLimit || clock() - StartTime > MAX_TIME){
        isTimeLimit = 1;
        return NONE_VALUE;
    }

    int move_num = 0;       // 着法数量
    // 生成着法
    MoveSort(situation, move_num, move_list, move, step);
    for(int i = 0; i < move_num; i++){
        move = move_list[i];
        if(move.from == 0 && move.to == 0) continue;
        // 下子
        if(MakeAMove(situation, move)){
            value = -MAX_VALUE + step;
        }
        else{
            value = -SearchCut(situation, depth - 1, 1 - beta, true);
        }
        // 回溯
        UnMakeAMove(situation);

        if(value > best){
            best = value;           // 更新最佳分数
            good_move = move;       // 更新最佳着法
            if(value >= beta){
                // 此着法是好着法，记录进历史表和杀手表
                SetBestMove(move, step, depth);
                SaveHashTable(depth, beta, hashBETA, move);
                return beta;
            }
        }
    }

    SaveHashTable(depth, beta - 1, hashALPHA, good_move);
    return beta - 1;
}